

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O1

Result __thiscall
wabt::interp::anon_unknown_1::BinaryReaderInterp::OnElemSegmentElemExpr_RefFunc
          (BinaryReaderInterp *this,Index segment_index,Index func_index)

{
  State *pSVar1;
  Result RVar2;
  Location loc;
  Location loc_1;
  Location local_b8;
  Location local_98;
  Var local_78;
  
  local_b8.field_1.field_0.last_column = 0;
  local_b8.filename._M_len = (this->filename_)._M_len;
  local_b8.filename._M_str = (this->filename_)._M_str;
  pSVar1 = (this->super_BinaryReaderNop).super_BinaryReaderDelegate.state;
  local_b8.field_1.field_1.offset =
       (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)pSVar1->offset;
  local_98.field_1.field_0.last_column = 0;
  local_98.filename._M_len = (this->filename_)._M_len;
  local_98.filename._M_str = (this->filename_)._M_str;
  local_98.field_1.field_1.offset =
       (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)pSVar1->offset;
  Var::Var(&local_78,func_index,&local_98);
  RVar2 = SharedValidator::OnElemSegmentElemExpr_RefFunc(&this->validator_,&local_b8,&local_78);
  Var::~Var(&local_78);
  if (RVar2.enum_ != Error) {
    local_b8.filename._M_len = CONCAT44(func_index,1);
    std::vector<wabt::interp::ElemExpr,_std::allocator<wabt::interp::ElemExpr>_>::
    emplace_back<wabt::interp::ElemExpr>
              (&(this->module_->elems).
                super__Vector_base<wabt::interp::ElemDesc,_std::allocator<wabt::interp::ElemDesc>_>.
                _M_impl.super__Vector_impl_data._M_finish[-1].elements,(ElemExpr *)&local_b8);
  }
  return (Result)(uint)(RVar2.enum_ == Error);
}

Assistant:

Result BinaryReaderInterp::OnElemSegmentElemExpr_RefFunc(Index segment_index,
                                                         Index func_index) {
  CHECK_RESULT(validator_.OnElemSegmentElemExpr_RefFunc(
      GetLocation(), Var(func_index, GetLocation())));
  ElemDesc& elem = module_.elems.back();
  elem.elements.push_back(ElemExpr{ElemKind::RefFunc, func_index});
  return Result::Ok;
}